

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall MeshLib::List<MeshLib::Face>::contains(List<MeshLib::Face> *this,Face *t)

{
  ListNode<MeshLib::Face> *this_00;
  Face **ppFVar1;
  ListNode<MeshLib::Face> **ppLVar2;
  ListNode<MeshLib::Face> *h;
  Face *t_local;
  List<MeshLib::Face> *this_local;
  
  this_00 = this->m_head;
  while( true ) {
    if (this_00 == (ListNode<MeshLib::Face> *)0x0) {
      return false;
    }
    ppFVar1 = ListNode<MeshLib::Face>::data(this_00);
    if (*ppFVar1 == t) break;
    ppLVar2 = ListNode<MeshLib::Face>::next(this_00);
    this_00 = *ppLVar2;
  }
  return true;
}

Assistant:

bool List<T>::contains( T * t )
{
	ListNode<T> * h = m_head;

	if( !h )
	{
		return false;
	}
	
	do{
		if( h->data() == t ) return true;
		h = h->next();
	}while( h != NULL );

	return false;
}